

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  reference ppcVar6;
  char *pcVar7;
  ulong uVar8;
  ostream *poVar9;
  cmake *this_00;
  cmGlobalGenerator *pcVar10;
  string *psVar11;
  cmCTestConfigureHandler *handler;
  string local_4c0;
  char *local_4a0;
  char *labelsForSubprojects;
  string local_490;
  allocator<char> local_469;
  string local_468;
  char *local_448;
  char *cmakeGeneratorToolset;
  string local_438;
  char *local_418;
  char *cmakeGeneratorPlatform;
  string local_408;
  reference local_3e8;
  string *option;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_3c0 [8];
  string cmakeConfigureCommand;
  string local_398;
  cmGlobalGenerator *local_378;
  cmGlobalGenerator *gg;
  undefined1 local_368 [6];
  bool cmakeBuildTypeInOptions;
  bool multiConfig;
  undefined1 local_348 [8];
  ostringstream e;
  undefined1 local_1d0 [8];
  string cmakelists_file;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  string *source_dir;
  string local_130;
  char *local_110;
  char *cmakeGeneratorName;
  string local_100;
  char *local_e0;
  char *ctestConfigureCommand;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  cmCTestConfigureCommand *this_local;
  
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,7);
  if (*ppcVar6 != (value_type)0x0) {
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,7);
    pcVar7 = *ppcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar7,&local_51);
    cmSystemTools::ExpandListArgument
              (&local_50,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"BuildDirectory",&local_a9)
  ;
  cmCTest::GetCTestConfiguration(&local_88,pcVar1,&local_a8);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,(allocator<char> *)((long)&ctestConfigureCommand + 7));
    cmCommand::SetError((cmCommand *)this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ctestConfigureCommand + 7));
    this_local = (cmCTestConfigureCommand *)0x0;
    ctestConfigureCommand._0_4_ = 1;
    goto LAB_00233922;
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"CTEST_CONFIGURE_COMMAND",
             (allocator<char> *)((long)&cmakeGeneratorName + 7));
  pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeGeneratorName + 7));
  local_e0 = pcVar7;
  if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"CTEST_CMAKE_GENERATOR",
               (allocator<char> *)((long)&source_dir + 7));
    pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)((long)&source_dir + 7));
    local_110 = pcVar7;
    if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_490,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,(allocator<char> *)((long)&labelsForSubprojects + 7));
      cmCommand::SetError((cmCommand *)this,&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator((allocator<char> *)((long)&labelsForSubprojects + 7));
      this_local = (cmCTestConfigureCommand *)0x0;
      ctestConfigureCommand._0_4_ = 1;
      goto LAB_00233922;
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"SourceDirectory",&local_181);
    cmCTest::GetCTestConfiguration(&local_160,pcVar1,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    local_140 = &local_160;
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     local_140,"/CMakeLists.txt");
      bVar4 = cmsys::SystemTools::FileExists((string *)local_1d0);
      if (bVar4) {
        gg._7_1_ = 0;
        gg._6_1_ = 0;
        this_00 = cmMakefile::GetCMakeInstance
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                             super_cmCommand.Makefile);
        pcVar7 = local_110;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_398,pcVar7,
                   (allocator<char> *)(cmakeConfigureCommand.field_2._M_local_buf + 0xf));
        pcVar10 = cmake::CreateGlobalGenerator(this_00,&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(cmakeConfigureCommand.field_2._M_local_buf + 0xf));
        local_378 = pcVar10;
        if (pcVar10 != (cmGlobalGenerator *)0x0) {
          iVar5 = (*pcVar10->_vptr_cmGlobalGenerator[0x23])();
          gg._7_1_ = (byte)iVar5 & 1;
          if (local_378 != (cmGlobalGenerator *)0x0) {
            (*local_378->_vptr_cmGlobalGenerator[1])();
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_3c0,"\"",(allocator<char> *)((long)&__range3 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
        psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::__cxx11::string::operator+=(local_3c0,(string *)psVar11);
        std::__cxx11::string::operator+=(local_3c0,"\"");
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_30);
        option = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_30);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&option), bVar4) {
          local_3e8 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          std::__cxx11::string::operator+=(local_3c0," \"");
          std::__cxx11::string::operator+=(local_3c0,(string *)local_3e8);
          std::__cxx11::string::operator+=(local_3c0,"\"");
          pcVar7 = (char *)std::__cxx11::string::c_str();
          pcVar7 = strstr(pcVar7,"CMAKE_BUILD_TYPE=");
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)std::__cxx11::string::c_str();
            pcVar7 = strstr(pcVar7,"CMAKE_BUILD_TYPE:STRING=");
            if (pcVar7 != (char *)0x0) goto LAB_00233212;
          }
          else {
LAB_00233212:
            gg._6_1_ = 1;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        if (((gg._7_1_ & 1) == 0) && ((gg._6_1_ & 1) == 0)) {
          cmCTest::GetConfigType_abi_cxx11_
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::string::operator+=(local_3c0," \"-DCMAKE_BUILD_TYPE:STRING=");
            psVar11 = cmCTest::GetConfigType_abi_cxx11_
                                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
            std::__cxx11::string::operator+=(local_3c0,(string *)psVar11);
            std::__cxx11::string::operator+=(local_3c0,"\"");
          }
        }
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"CTEST_USE_LAUNCHERS",
                   (allocator<char> *)((long)&cmakeGeneratorPlatform + 7));
        bVar4 = cmMakefile::IsOn(pcVar2,&local_408);
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeGeneratorPlatform + 7));
        if (bVar4) {
          std::__cxx11::string::operator+=(local_3c0," \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"");
        }
        std::__cxx11::string::operator+=(local_3c0," \"-G");
        std::__cxx11::string::operator+=(local_3c0,local_110);
        std::__cxx11::string::operator+=(local_3c0,"\"");
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_438,"CTEST_CMAKE_GENERATOR_PLATFORM",
                   (allocator<char> *)((long)&cmakeGeneratorToolset + 7));
        pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_438);
        std::__cxx11::string::~string((string *)&local_438);
        std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeGeneratorToolset + 7));
        local_418 = pcVar7;
        if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
          std::__cxx11::string::operator+=(local_3c0," \"-A");
          std::__cxx11::string::operator+=(local_3c0,local_418);
          std::__cxx11::string::operator+=(local_3c0,"\"");
        }
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"CTEST_CMAKE_GENERATOR_TOOLSET",&local_469);
        pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_468);
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator(&local_469);
        local_448 = pcVar7;
        if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
          std::__cxx11::string::operator+=(local_3c0," \"-T");
          std::__cxx11::string::operator+=(local_3c0,local_448);
          std::__cxx11::string::operator+=(local_3c0,"\"");
        }
        std::__cxx11::string::operator+=(local_3c0," \"");
        std::__cxx11::string::operator+=(local_3c0,(string *)local_140);
        std::__cxx11::string::operator+=(local_3c0,"\"");
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::SetCTestConfiguration
                  (pcVar1,"ConfigureCommand",pcVar7,
                   (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
        std::__cxx11::string::~string(local_3c0);
        ctestConfigureCommand._0_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
        poVar9 = std::operator<<((ostream *)local_348,"CMakeLists.txt file does not exist [");
        poVar9 = std::operator<<(poVar9,(string *)local_1d0);
        std::operator<<(poVar9,"]");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError((cmCommand *)this,(string *)local_368);
        std::__cxx11::string::~string((string *)local_368);
        this_local = (cmCTestConfigureCommand *)0x0;
        ctestConfigureCommand._0_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
      }
      std::__cxx11::string::~string((string *)local_1d0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,(allocator<char> *)(cmakelists_file.field_2._M_local_buf + 0xf));
      cmCommand::SetError((cmCommand *)this,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(cmakelists_file.field_2._M_local_buf + 0xf));
      this_local = (cmCTestConfigureCommand *)0x0;
      ctestConfigureCommand._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&local_160);
    if ((int)ctestConfigureCommand != 0) goto LAB_00233922;
  }
  else {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
               pcVar7,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"CTEST_LABELS_FOR_SUBPROJECTS",
             (allocator<char> *)((long)&handler + 7));
  pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
  local_4a0 = pcVar7;
  if (pcVar7 != (char *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,pcVar7,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  this_local = (cmCTestConfigureCommand *)
               cmCTest::GetConfigureHandler
                         ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*((cmCTestGenericHandler *)this_local)->_vptr_cmCTestGenericHandler[3])();
  cmCTestGenericHandler::SetQuiet
            ((cmCTestGenericHandler *)this_local,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  ctestConfigureCommand._0_4_ = 1;
LAB_00233922:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return (cmCTestGenericHandler *)this_local;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  std::vector<std::string> options;

  if (this->Values[ctc_OPTIONS]) {
    cmSystemTools::ExpandListArgument(this->Values[ctc_OPTIONS], options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  const char* ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (ctestConfigureCommand && *ctestConfigureCommand) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       ctestConfigureCommand, this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmakeGeneratorName && *cmakeGeneratorName) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      cmGlobalGenerator* gg =
        this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        delete gg;
      }

      std::string cmakeConfigureCommand = "\"";
      cmakeConfigureCommand += cmSystemTools::GetCMakeCommand();
      cmakeConfigureCommand += "\"";

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      const char* cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmakeGeneratorPlatform && *cmakeGeneratorPlatform) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      const char* cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmakeGeneratorToolset && *cmakeGeneratorToolset) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration(
        "ConfigureCommand", cmakeConfigureCommand.c_str(), this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}